

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O0

t_int * sigsamphold_perform(t_int *w)

{
  float fVar1;
  long lVar2;
  t_int tVar3;
  t_sample local_40;
  t_sample next;
  t_sample lastout;
  t_sample lastin;
  int i;
  int n;
  t_sigsamphold *x;
  t_sample *out;
  t_sample *in2;
  t_sample *in1;
  t_int *w_local;
  
  in2 = (t_sample *)w[1];
  lVar2 = w[4];
  tVar3 = w[5];
  local_40 = *(t_sample *)(lVar2 + 0x38);
  next = *(t_sample *)(lVar2 + 0x34);
  x = (t_sigsamphold *)w[3];
  out = (t_sample *)w[2];
  for (lastout = 0.0; (int)lastout < (int)tVar3; lastout = (t_sample)((int)lastout + 1)) {
    fVar1 = *out;
    if (fVar1 < next) {
      local_40 = *in2;
    }
    *(t_sample *)&(x->x_obj).te_g.g_pd = local_40;
    in2 = in2 + 1;
    next = fVar1;
    x = (t_sigsamphold *)((long)&(x->x_obj).te_g.g_pd + 4);
    out = out + 1;
  }
  *(t_sample *)(lVar2 + 0x34) = next;
  *(t_sample *)(lVar2 + 0x38) = local_40;
  return w + 6;
}

Assistant:

static t_int *sigsamphold_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    t_sigsamphold *x = (t_sigsamphold *)(w[4]);
    int n = (int)w[5];
    int i;
    t_sample lastin = x->x_lastin;
    t_sample lastout = x->x_lastout;
    for (i = 0; i < n; i++, in1++)
    {
        t_sample next = *in2++;
        if (next < lastin) lastout = *in1;
        *out++ = lastout;
        lastin = next;
    }
    x->x_lastin = lastin;
    x->x_lastout = lastout;
    return (w+6);
}